

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

void __thiscall
capnp::PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>::
PipelineBuilder(PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
                *this,uint firstSegmentWords)

{
  PipelineBuilderPair PStack_38;
  
  capnp::_::newPipelineBuilder(0);
  PipelineBuilder(this,&PStack_38);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&PStack_38.hook);
  return;
}

Assistant:

PipelineBuilder<T>::PipelineBuilder(uint firstSegmentWords)
    : PipelineBuilder(_::newPipelineBuilder(firstSegmentWords)) {}